

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall
miniros::MasterLink::setParamImpl<int>
          (MasterLink *this,string *key,vector<int,_std::allocator<int>_> *vec)

{
  size_type sVar1;
  vector<int,_std::allocator<int>_> *in_RDX;
  size_t i;
  RpcValue xml_vec;
  RpcValue *in_stack_000000b0;
  string *in_stack_000000b8;
  MasterLink *in_stack_000000c0;
  XmlRpcValue *in_stack_ffffffffffffff98;
  XmlRpcValue *in_stack_ffffffffffffffa0;
  ulong local_40;
  int *in_stack_ffffffffffffffc8;
  XmlRpcValue *in_stack_ffffffffffffffd0;
  XmlRpcValue local_28;
  vector<int,_std::allocator<int>_> *local_18;
  
  local_18 = in_RDX;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_28);
  std::vector<int,_std::allocator<int>_>::size(local_18);
  XmlRpc::XmlRpcValue::setSize
            (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(local_18);
    if (sVar1 <= local_40) break;
    in_stack_ffffffffffffffa0 =
         (XmlRpcValue *)
         std::vector<int,_std::allocator<int>_>::at
                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                    (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 =
         XmlRpc::XmlRpcValue::operator[]
                   (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_40 = local_40 + 1;
  }
  set(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45ff14);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::vector<T>& vec)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertArray turns it
  // into an array type with the given size
  RpcValue xml_vec;
  xml_vec.setSize(vec.size());

  // Copy the contents into the XmlRpcValue
  for (size_t i = 0; i < vec.size(); i++) {
    xml_vec[i] = vec.at(i);
  }

  this->set(key, xml_vec);
}